

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

int Abc_SopIsOrType(char *pSop)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  
  lVar2 = 0;
  do {
    if (pSop[lVar2] == '\0') {
      iVar1 = -1;
LAB_001edfd2:
      iVar5 = 0;
      iVar3 = 0;
      if ((pSop != (char *)0x0) && (cVar4 = *pSop, cVar4 != '\0')) {
        pcVar6 = pSop + 1;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(cVar4 == '\n');
          cVar4 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar4 != '\0');
      }
      if (iVar1 == iVar3) {
        cVar4 = *pSop;
        if (cVar4 != '\0') {
          iVar1 = iVar1 + 3;
          pcVar6 = pSop + 1;
          do {
            if (cVar4 == ' ') {
              return 0;
            }
            iVar5 = 0;
            pcVar7 = pcVar6;
            do {
              iVar5 = iVar5 + (uint)(cVar4 != '-');
              cVar4 = *pcVar7;
              pcVar7 = pcVar7 + 1;
            } while (cVar4 != ' ');
            if (iVar5 != 1) {
              return 0;
            }
            cVar4 = pSop[iVar1];
            pSop = pSop + iVar1;
            pcVar6 = pcVar6 + iVar1;
          } while (cVar4 != '\0');
        }
        iVar5 = 1;
      }
      return iVar5;
    }
    if (pSop[lVar2] == '\n') {
      iVar1 = (int)lVar2 + -2;
      goto LAB_001edfd2;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int Abc_SopIsOrType( char * pSop )
{
    char * pCube, * pCur;
    int nVars, nLits;
    nVars = Abc_SopGetVarNum( pSop );
    if ( nVars != Abc_SopGetCubeNum(pSop) )
        return 0;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        // count the number of literals in the cube
        nLits = 0;
        for ( pCur = pCube; *pCur != ' '; pCur++ )
            nLits += ( *pCur != '-' );
        if ( nLits != 1 )
            return 0;
    }
    return 1;
}